

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O2

void __thiscall wasm::CodePushing::CodePushing(CodePushing *this)

{
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>).
  super_Pass.runner = (PassRunner *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>).
  super_Pass.name._M_dataplus._M_p =
       (pointer)&(this->
                 super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                 ).super_Pass.name.field_2;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>).
  super_Pass.name._M_string_length = 0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>).
  super_Pass.name.field_2._M_local_buf[0] = '\0';
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>).
  super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
  super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.replacep =
       (Expression **)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>).
  super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
  super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.stack.usedFixed = 0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>).
  super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
  super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::Task,_std::allocator<wasm::Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
           ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
           super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::Task,_std::allocator<wasm::Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::Task>_>
           ._M_impl + 8) = (pointer)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>).
  super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
  super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.currModule =
       (Module *)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
           ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
           super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::Task,_std::allocator<wasm::Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::Task>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>).
  super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
  super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.currFunction =
       (Function *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>).
  super_Pass._vptr_Pass = (_func_int **)&PTR__CodePushing_00e1dcb8;
  (this->analyzer).super_PostWalker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.
  super_Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.replacep =
       (Expression **)0x0;
  (this->analyzer).super_PostWalker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.
  super_Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.stack.usedFixed = 0;
  (this->analyzer).sfa.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->analyzer).sfa.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  (this->analyzer).super_PostWalker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.
  super_Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->analyzer).
           super_PostWalker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.
           super_Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>::Task>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->analyzer).
           super_PostWalker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.
           super_Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>::Task>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (this->analyzer).super_PostWalker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.
  super_Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.currFunction =
       (Function *)0x0;
  (this->analyzer).super_PostWalker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.
  super_Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>.currModule =
       (Module *)0x0;
  (this->analyzer).sfa.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->analyzer).sfa.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = 0;
  (this->analyzer).sfa.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->analyzer).numSets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->analyzer).numSets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->analyzer).numSets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->analyzer).numGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->analyzer).numGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->analyzer).numGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->numGetsSoFar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->numGetsSoFar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->numGetsSoFar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<CodePushing>();
  }